

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cpp
# Opt level: O2

bool iDynTree::ArticulatedBodyAlgorithm
               (Model *model,Traversal *traversal,FreeFloatingPos *robotPos,
               FreeFloatingVel *robotVel,LinkNetExternalWrenches *linkExtWrenches,
               JointDOFsDoubleArray *jointTorques,ArticulatedBodyAlgorithmInternalBuffers *bufs,
               FreeFloatingAcc *robotAcc)

{
  LinkVelArray *this;
  DOFSpatialForceArray *this_00;
  JointDOFsDoubleArray *this_01;
  LinkAccArray *this_02;
  LinkArticulatedBodyInertias *this_03;
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  LinkWrenches *this_04;
  Link *pLVar6;
  LinkIndex LVar7;
  Link *this_05;
  IJoint *pIVar8;
  LinkIndex LVar9;
  size_t sVar10;
  SpatialMotionVector *pSVar11;
  VectorDynSize *pVVar12;
  JointPosDoubleArray *pJVar13;
  undefined4 extraout_var_00;
  Twist *pTVar14;
  SpatialAcc *pSVar15;
  Twist *this_06;
  LinkIndex LVar16;
  undefined4 extraout_var_01;
  SpatialInertia *pSVar17;
  ArticulatedBodyInertia *pAVar18;
  Wrench *pWVar19;
  undefined4 extraout_var_02;
  SpatialForceVector *pSVar20;
  SpatialVector<iDynTree::SpatialMotionVector> *pSVar21;
  double *pdVar22;
  DualVectorT *other;
  undefined4 extraout_var_03;
  LinkAccArray *this_07;
  ulong dof;
  undefined4 extraout_var_05;
  SpatialAcc *this_08;
  undefined4 extraout_var_06;
  JointDOFsDoubleArray *this_09;
  ulong uVar23;
  uint traversalEl;
  Wrench pa;
  Transform parent_X_visited;
  Twist vj;
  undefined1 local_398 [16];
  scalar_constant_op<double> sStack_388;
  AngularVector3T *local_380;
  double dStack_378;
  double local_370;
  undefined8 uStack_368;
  Wrench local_2c0;
  ArticulatedBodyInertia local_288 [56];
  SpatialInertia local_250 [2];
  SpatialAcc local_178 [4];
  SpatialForceVector local_a0 [56];
  Wrench local_68;
  undefined4 extraout_var;
  undefined4 extraout_var_04;
  
  this = &bufs->linksVel;
  this_02 = &bufs->linksBiasAcceleration;
  this_03 = &bufs->linkABIs;
  this_04 = &bufs->linksBiasWrench;
  uVar23 = 0;
  do {
    uVar4 = Traversal::getNrOfVisitedLinks(traversal);
    if (uVar4 <= uVar23) {
      uVar4 = Traversal::getNrOfVisitedLinks(traversal);
      this_00 = &bufs->U;
      this_01 = &bufs->D;
      this_09 = &bufs->u;
      while (uVar4 = uVar4 - 1, -1 < (int)uVar4) {
        uVar23 = (ulong)(uVar4 & 0x7fffffff);
        pLVar6 = Traversal::getLink(traversal,uVar23);
        LVar7 = Link::getIndex(pLVar6);
        pLVar6 = Traversal::getParentLink(traversal,uVar23);
        pIVar8 = Traversal::getParentJoint(traversal,uVar23);
        if (pLVar6 != (Link *)0x0) {
          iDynTree::ArticulatedBodyInertia::ArticulatedBodyInertia
                    ((ArticulatedBodyInertia *)local_178);
          local_2c0._40_8_ = 0;
          local_2c0._48_8_ = 0;
          local_2c0._24_8_ = 0;
          local_2c0._32_8_ = 0;
          local_2c0._8_8_ = 0;
          local_2c0._16_8_ = 0;
          local_2c0._0_8_ = &PTR__SpatialForceVector_001e5f50;
          iVar5 = (*pIVar8->_vptr_IJoint[4])(pIVar8);
          if (iVar5 != 0) {
            iVar5 = (*pIVar8->_vptr_IJoint[0x18])(pIVar8);
            sVar10 = CONCAT44(extraout_var_02,iVar5);
            pAVar18 = LinkArticulatedBodyInertias::operator()(this_03,LVar7);
            DOFSpatialMotionArray::operator()(&bufs->S,sVar10);
            iDynTree::ArticulatedBodyInertia::operator*
                      ((ArticulatedBodyInertia *)local_398,(SpatialMotionVector *)pAVar18);
            pSVar20 = DOFSpatialForceArray::operator()(this_00,sVar10);
            *(double *)(pSVar20 + 0x28) = local_370;
            *(undefined8 *)(pSVar20 + 0x30) = uStack_368;
            *(AngularVector3T **)(pSVar20 + 0x18) = local_380;
            *(double *)(pSVar20 + 0x20) = dStack_378;
            *(undefined8 *)(pSVar20 + 8) = local_398._8_8_;
            *(double *)(pSVar20 + 0x10) = sStack_388.m_other;
            iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_398);
            pSVar21 = &DOFSpatialMotionArray::operator()(&bufs->S,sVar10)->
                       super_SpatialVector<iDynTree::SpatialMotionVector>;
            pSVar20 = DOFSpatialForceArray::operator()(this_00,sVar10);
            dVar1 = SpatialVector<iDynTree::SpatialMotionVector>::dot(pSVar21,pSVar20);
            pdVar22 = (double *)
                      iDynTree::VectorDynSize::operator()(&this_01->super_VectorDynSize,sVar10);
            *pdVar22 = dVar1;
            dVar1 = (double)iDynTree::VectorDynSize::operator()
                                      (&jointTorques->super_VectorDynSize,sVar10);
            pSVar21 = &DOFSpatialMotionArray::operator()(&bufs->S,sVar10)->
                       super_SpatialVector<iDynTree::SpatialMotionVector>;
            other = &LinkWrenches::operator()(this_04,LVar7)->super_SpatialForceVector;
            dVar2 = SpatialVector<iDynTree::SpatialMotionVector>::dot(pSVar21,other);
            pdVar22 = (double *)
                      iDynTree::VectorDynSize::operator()(&this_09->super_VectorDynSize,sVar10);
            *pdVar22 = dVar1 - dVar2;
            pAVar18 = LinkArticulatedBodyInertias::operator()(this_03,LVar7);
            DOFSpatialForceArray::operator()(this_00,sVar10);
            pdVar22 = (double *)
                      iDynTree::VectorDynSize::operator()(&this_01->super_VectorDynSize,sVar10);
            iDynTree::ArticulatedBodyInertia::ABADyadHelper
                      ((SpatialForceVector *)local_250,*pdVar22);
            iDynTree::ArticulatedBodyInertia::operator-((ArticulatedBodyInertia *)local_398,pAVar18)
            ;
            memcpy(local_178,local_398,0xd8);
            pWVar19 = LinkWrenches::operator()(this_04,LVar7);
            LinkAccArray::operator()(this_02,LVar7);
            iDynTree::ArticulatedBodyInertia::operator*(local_288,local_178);
            iDynTree::Wrench::operator+((Wrench *)local_250,pWVar19);
            DOFSpatialForceArray::operator()(this_00,sVar10);
            pdVar22 = (double *)
                      iDynTree::VectorDynSize::operator()(&this_09->super_VectorDynSize,sVar10);
            dVar1 = *pdVar22;
            pdVar22 = (double *)
                      iDynTree::VectorDynSize::operator()(&this_01->super_VectorDynSize,sVar10);
            iDynTree::SpatialForceVector::operator*(local_a0,dVar1 / *pdVar22);
            iDynTree::Wrench::Wrench(&local_68,local_a0);
            iDynTree::Wrench::operator+((Wrench *)local_398,(Wrench *)local_250);
            iDynTree::Wrench::operator=(&local_2c0,(Wrench *)local_398);
            iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_398);
            iDynTree::SpatialForceVector::~SpatialForceVector(&local_68.super_SpatialForceVector);
            iDynTree::SpatialForceVector::~SpatialForceVector(local_a0);
            iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_250);
            iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_288);
          }
          iVar5 = (*pIVar8->_vptr_IJoint[4])(pIVar8);
          if (iVar5 == 0) {
            pAVar18 = LinkArticulatedBodyInertias::operator()(this_03,LVar7);
            memcpy(local_178,pAVar18,0xd8);
            pWVar19 = LinkWrenches::operator()(this_04,LVar7);
            LinkAccArray::operator()(this_02,LVar7);
            iDynTree::ArticulatedBodyInertia::operator*
                      ((ArticulatedBodyInertia *)local_250,local_178);
            iDynTree::Wrench::operator+((Wrench *)local_398,pWVar19);
            iDynTree::Wrench::operator=(&local_2c0,(Wrench *)local_398);
            iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_398);
            iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_250);
          }
          LVar9 = Link::getIndex(pLVar6);
          pJVar13 = FreeFloatingPos::jointPos(robotPos);
          iVar5 = (*pIVar8->_vptr_IJoint[10])(pIVar8,pJVar13,LVar9,LVar7);
          iDynTree::Transform::Transform
                    ((Transform *)local_250,(Transform *)CONCAT44(extraout_var_03,iVar5));
          iDynTree::Transform::operator*((Transform *)local_398,(ArticulatedBodyInertia *)local_250)
          ;
          pAVar18 = LinkArticulatedBodyInertias::operator()(this_03,LVar9);
          iDynTree::ArticulatedBodyInertia::operator+=(pAVar18,(ArticulatedBodyInertia *)local_398);
          pWVar19 = LinkWrenches::operator()(this_04,LVar9);
          iDynTree::Transform::operator*((Transform *)local_288,(Wrench *)local_250);
          iDynTree::Wrench::operator+((Wrench *)local_398,pWVar19);
          pWVar19 = LinkWrenches::operator()(this_04,LVar9);
          iDynTree::Wrench::operator=(pWVar19,(Wrench *)local_398);
          iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_398);
          iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_288);
          iDynTree::SpatialForceVector::~SpatialForceVector(&local_2c0.super_SpatialForceVector);
        }
      }
      this_07 = &bufs->linksAccelerations;
      for (uVar23 = 0; uVar4 = Traversal::getNrOfVisitedLinks(traversal), uVar23 < uVar4;
          uVar23 = uVar23 + 1) {
        pLVar6 = Traversal::getLink(traversal,uVar23);
        LVar7 = Link::getIndex(pLVar6);
        pLVar6 = Traversal::getParentLink(traversal,uVar23);
        pIVar8 = Traversal::getParentJoint(traversal,uVar23);
        if (pLVar6 == (Link *)0x0) {
          LinkArticulatedBodyInertias::operator()(this_03,LVar7);
          LinkWrenches::operator()(this_04,LVar7);
          iDynTree::ArticulatedBodyInertia::applyInverse((Wrench *)local_398);
          iDynTree::SpatialAcc::operator-(local_178);
          pSVar15 = LinkAccArray::operator()(this_07,LVar7);
          iDynTree::SpatialAcc::operator=(pSVar15,local_178);
          pSVar15 = LinkAccArray::operator()(this_07,LVar7);
          this_08 = FreeFloatingAcc::baseAcc(robotAcc);
          iDynTree::SpatialAcc::operator=(this_08,pSVar15);
        }
        else {
          LVar9 = Link::getIndex(pLVar6);
          iVar5 = (*pIVar8->_vptr_IJoint[4])(pIVar8);
          if (iVar5 == 0) {
            pJVar13 = FreeFloatingPos::jointPos(robotPos);
            iVar5 = (*pIVar8->_vptr_IJoint[10])(pIVar8,pJVar13,LVar7,LVar9);
            LinkAccArray::operator()(this_07,LVar9);
            iDynTree::Transform::operator*
                      ((Transform *)local_398,(SpatialAcc *)CONCAT44(extraout_var_06,iVar5));
            LinkAccArray::operator()(this_02,LVar7);
            iDynTree::SpatialAcc::operator+(local_178,(SpatialAcc *)local_398);
          }
          else {
            iVar5 = (*pIVar8->_vptr_IJoint[0x18])(pIVar8);
            dof = CONCAT44(extraout_var_04,iVar5);
            pJVar13 = FreeFloatingPos::jointPos(robotPos);
            iVar5 = (*pIVar8->_vptr_IJoint[10])(pIVar8,pJVar13,LVar7,LVar9);
            LinkAccArray::operator()(this_07,LVar9);
            iDynTree::Transform::operator*
                      ((Transform *)local_398,(SpatialAcc *)CONCAT44(extraout_var_05,iVar5));
            LinkAccArray::operator()(this_02,LVar7);
            iDynTree::SpatialAcc::operator+(local_178,(SpatialAcc *)local_398);
            pSVar15 = LinkAccArray::operator()(this_07,LVar7);
            iDynTree::SpatialAcc::operator=(pSVar15,local_178);
            pdVar22 = (double *)
                      iDynTree::VectorDynSize::operator()(&this_09->super_VectorDynSize,dof);
            dVar1 = *pdVar22;
            pSVar20 = DOFSpatialForceArray::operator()(this_00,dof);
            pSVar15 = LinkAccArray::operator()(this_07,LVar7);
            dVar3 = SpatialVector<iDynTree::SpatialForceVector>::dot
                              ((SpatialVector<iDynTree::SpatialForceVector> *)(pSVar20 + 8),
                               &pSVar15->super_SpatialMotionVector);
            pdVar22 = (double *)
                      iDynTree::VectorDynSize::operator()(&this_01->super_VectorDynSize,dof);
            dVar2 = *pdVar22;
            pVVar12 = &FreeFloatingAcc::jointAcc(robotAcc)->super_VectorDynSize;
            pdVar22 = (double *)iDynTree::VectorDynSize::operator()(pVVar12,dof);
            *pdVar22 = (dVar1 - dVar3) / dVar2;
            pSVar15 = LinkAccArray::operator()(this_07,LVar7);
            DOFSpatialMotionArray::operator()(&bufs->S,dof);
            pVVar12 = &FreeFloatingAcc::jointAcc(robotAcc)->super_VectorDynSize;
            pdVar22 = (double *)iDynTree::VectorDynSize::operator()(pVVar12,dof);
            iDynTree::SpatialMotionVector::operator*((SpatialMotionVector *)local_250,*pdVar22);
            iDynTree::SpatialAcc::SpatialAcc
                      ((SpatialAcc *)local_398,(SpatialMotionVector *)local_250);
            iDynTree::SpatialAcc::operator+(local_178,pSVar15);
          }
          pSVar15 = LinkAccArray::operator()(this_07,LVar7);
          iDynTree::SpatialAcc::operator=(pSVar15,local_178);
        }
      }
      return true;
    }
    pLVar6 = Traversal::getLink(traversal,uVar23);
    LVar7 = Link::getIndex(pLVar6);
    this_05 = Traversal::getParentLink(traversal,uVar23);
    pIVar8 = Traversal::getParentJoint(traversal,uVar23);
    if (this_05 == (Link *)0x0) {
      pTVar14 = FreeFloatingVel::baseVel(robotVel);
      this_06 = LinkVelArray::operator()(this,LVar7);
      iDynTree::Twist::operator=(this_06,pTVar14);
      SpatialVector<iDynTree::SpatialMotionVector>::Zero();
LAB_00194754:
      iDynTree::SpatialAcc::SpatialAcc(local_178,(SpatialMotionVector *)local_398);
      pSVar15 = LinkAccArray::operator()(this_02,LVar7);
      iDynTree::SpatialAcc::operator=(pSVar15,local_178);
    }
    else {
      LVar9 = Link::getIndex(this_05);
      iVar5 = (*pIVar8->_vptr_IJoint[4])(pIVar8);
      if (iVar5 == 0) {
        pJVar13 = FreeFloatingPos::jointPos(robotPos);
        LVar16 = Link::getIndex(this_05);
        iVar5 = (*pIVar8->_vptr_IJoint[10])(pIVar8,pJVar13,LVar7,LVar16);
        LinkVelArray::operator()(this,LVar9);
        iDynTree::Transform::operator*
                  ((Transform *)local_178,(Twist *)CONCAT44(extraout_var_01,iVar5));
        pTVar14 = LinkVelArray::operator()(this,LVar7);
        iDynTree::Twist::operator=(pTVar14,(Twist *)local_178);
        SpatialVector<iDynTree::SpatialMotionVector>::Zero();
        goto LAB_00194754;
      }
      iVar5 = (*pIVar8->_vptr_IJoint[0x18])(pIVar8);
      sVar10 = CONCAT44(extraout_var,iVar5);
      (*pIVar8->_vptr_IJoint[0xc])((Twist *)local_178,pIVar8,0,LVar7,LVar9);
      pSVar11 = DOFSpatialMotionArray::operator()(&bufs->S,sVar10);
      (pSVar11->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data
      [0] = local_178[0].super_SpatialMotionVector.
            super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0];
      (pSVar11->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data
      [1] = local_178[0].super_SpatialMotionVector.
            super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[1];
      (pSVar11->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data
      [2] = local_178[0].super_SpatialMotionVector.
            super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2];
      (pSVar11->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data
      [0] = local_178[0].super_SpatialMotionVector.
            super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[0];
      (pSVar11->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data
      [1] = local_178[0].super_SpatialMotionVector.
            super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[1];
      (pSVar11->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data
      [2] = local_178[0].super_SpatialMotionVector.
            super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[2];
      iDynTree::Twist::Twist((Twist *)local_178);
      pVVar12 = &FreeFloatingVel::jointVel(robotVel)->super_VectorDynSize;
      dVar1 = (double)iDynTree::VectorDynSize::operator()(pVVar12,sVar10);
      local_380 = (AngularVector3T *)DOFSpatialMotionArray::operator()(&bufs->S,sVar10);
      sStack_388.m_other = dVar1;
      local_250[0].m_mass = (double)local_178;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const>>
                ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_250,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)local_398);
      pVVar12 = &FreeFloatingVel::jointVel(robotVel)->super_VectorDynSize;
      dVar1 = (double)iDynTree::VectorDynSize::operator()(pVVar12,sVar10);
      pSVar11 = DOFSpatialMotionArray::operator()(&bufs->S,sVar10);
      local_380 = &(pSVar11->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3;
      local_250[0].m_mass =
           (double)&local_178[0].super_SpatialMotionVector.
                    super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3;
      sStack_388.m_other = dVar1;
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const>>
                ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_250,
                 (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)local_398);
      pJVar13 = FreeFloatingPos::jointPos(robotPos);
      iVar5 = (*pIVar8->_vptr_IJoint[10])(pIVar8,pJVar13,LVar7,LVar9);
      LinkVelArray::operator()(this,LVar9);
      iDynTree::Transform::operator*
                ((Transform *)local_250,(Twist *)CONCAT44(extraout_var_00,iVar5));
      iDynTree::Twist::operator+((Twist *)local_398,(Twist *)local_250);
      pTVar14 = LinkVelArray::operator()(this,LVar7);
      iDynTree::Twist::operator=(pTVar14,(Twist *)local_398);
      pTVar14 = LinkVelArray::operator()(this,LVar7);
      iDynTree::Twist::operator*((Twist *)local_398,pTVar14);
      pSVar15 = LinkAccArray::operator()(this_02,LVar7);
      iDynTree::SpatialAcc::operator=(pSVar15,(SpatialAcc *)local_398);
    }
    pSVar17 = Link::getInertia(pLVar6);
    iDynTree::ArticulatedBodyInertia::ArticulatedBodyInertia
              ((ArticulatedBodyInertia *)local_178,pSVar17);
    pAVar18 = LinkArticulatedBodyInertias::operator()(this_03,LVar7);
    memcpy(pAVar18,(ArticulatedBodyInertia *)local_178,0xd8);
    pTVar14 = LinkVelArray::operator()(this,LVar7);
    pSVar17 = Link::getInertia(pLVar6);
    LinkVelArray::operator()(this,LVar7);
    iDynTree::SpatialInertia::operator*(local_250,(Twist *)pSVar17);
    iDynTree::Twist::operator*((Twist *)local_398,(SpatialMomentum *)pTVar14);
    LinkWrenches::operator()(linkExtWrenches,LVar7);
    iDynTree::Wrench::operator-((Wrench *)local_178,(Wrench *)local_398);
    pWVar19 = LinkWrenches::operator()(this_04,LVar7);
    iDynTree::Wrench::operator=(pWVar19,(Wrench *)local_178);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_178);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_398);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_250);
    uVar23 = uVar23 + 1;
  } while( true );
}

Assistant:

bool ArticulatedBodyAlgorithm(const Model& model,
                              const Traversal& traversal,
                              const FreeFloatingPos& robotPos,
                              const FreeFloatingVel& robotVel,
                              const LinkNetExternalWrenches & linkExtWrenches,
                              const JointDOFsDoubleArray & jointTorques,
                                    ArticulatedBodyAlgorithmInternalBuffers & bufs,
                                    FreeFloatingAcc & robotAcc)
{
    /**
     * Forward pass: compute the link velocities and the link bias accelerations
     * and initialize the Articulated Body Inertia and the articulated bias wrench.
     */
    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex visitedLinkIndex = visitedLink->getIndex();
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

        // Propagate velocities and bias accelerations

        // If the visitedLink is the base one, initialize the velocity with the input velocity
        if( parentLink == 0 )
        {
            assert(visitedLinkIndex >= 0 && visitedLinkIndex < (LinkIndex)model.getNrOfLinks());
            bufs.linksVel(visitedLinkIndex) = robotVel.baseVel();
            bufs.linksBiasAcceleration(visitedLinkIndex) = SpatialAcc::Zero();
        }
        else
        {
            LinkIndex    parentLinkIndex = parentLink->getIndex();
            // Otherwise we propagate velocity in the usual way
            if( toParentJoint->getNrOfDOFs() == 0 )
            {
                bufs.linksVel(visitedLinkIndex) =
                    toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLink->getIndex())*bufs.linksVel(parentLinkIndex);
                bufs.linksBiasAcceleration(visitedLinkIndex) = SpatialAcc::Zero();
            }
            else
            {
                size_t dofIndex = toParentJoint->getDOFsOffset();
                bufs.S(dofIndex) = toParentJoint->getMotionSubspaceVector(0,visitedLinkIndex,parentLinkIndex);
                Twist vj;
                toEigen(vj.getLinearVec3()) = robotVel.jointVel()(dofIndex)*toEigen(bufs.S(dofIndex).getLinearVec3());
                toEigen(vj.getAngularVec3()) = robotVel.jointVel()(dofIndex)*toEigen(bufs.S(dofIndex).getAngularVec3());
                bufs.linksVel(visitedLinkIndex) =
                    toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLinkIndex)*bufs.linksVel(parentLinkIndex)
                    + vj;
                bufs.linksBiasAcceleration(visitedLinkIndex) = bufs.linksVel(visitedLinkIndex)*vj;

            }
        }

        // Initialize Articulated Body Inertia
        bufs.linkABIs(visitedLinkIndex) = visitedLink->getInertia();

        // Initialize bias force (note that we assume that the external frames are
        // expressed in a local frame, differently from Featherstone 2008
        bufs.linksBiasWrench(visitedLinkIndex) = bufs.linksVel(visitedLinkIndex)*(visitedLink->getInertia()*bufs.linksVel(visitedLinkIndex))
                                            - linkExtWrenches(visitedLinkIndex);
    }

    /*
     * Backward pass: recursivly compute
     * the articulated body inertia and the articulated body bias wrench.
     *
     */
    for(int traversalEl = traversal.getNrOfVisitedLinks()-1; traversalEl >= 0; traversalEl--)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkIndex    visitedLinkIndex = visitedLink->getIndex();
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

        if( parentLink )
        {
            ArticulatedBodyInertia Ia;
            Wrench pa;

            // For now we support only 0 and 1 dof joints

            // for 1 dof joints, the articulated inertia
            // need to be propagated to the parent considering
            // the joints
            if( toParentJoint->getNrOfDOFs() > 0 )
            {
                assert(toParentJoint->getNrOfDOFs()==1);
                size_t dofIndex = toParentJoint->getDOFsOffset();
                bufs.U(dofIndex) = bufs.linkABIs(visitedLinkIndex)*bufs.S(dofIndex);
                bufs.D(dofIndex) = bufs.S(dofIndex).dot(bufs.U(dofIndex));
                bufs.u(dofIndex) = jointTorques(dofIndex) - bufs.S(dofIndex).dot(bufs.linksBiasWrench(visitedLinkIndex));

                Ia = bufs.linkABIs(visitedLinkIndex) - ArticulatedBodyInertia::ABADyadHelper(bufs.U(dofIndex),bufs.D(dofIndex));

                pa                 =   bufs.linksBiasWrench(visitedLinkIndex)
                                     + Ia*bufs.linksBiasAcceleration(visitedLinkIndex)
                                     + bufs.U(dofIndex)*(bufs.u(dofIndex)/bufs.D(dofIndex));

            }

            // For fixed joints, we just need to propate
            // the articulated quantities without considering the
            // joint
            if( toParentJoint->getNrOfDOFs() == 0 )
            {
                Ia = bufs.linkABIs(visitedLinkIndex);
                pa                 =   bufs.linksBiasWrench(visitedLinkIndex)
                                     + Ia*bufs.linksBiasAcceleration(visitedLinkIndex);
            }

            //bufs.pa(visitedLinkIndex) = pa;

            // Propagate
            LinkIndex parentLinkIndex = parentLink->getIndex();
            Transform parent_X_visited = toParentJoint->getTransform(robotPos.jointPos(),parentLinkIndex,visitedLinkIndex);
            bufs.linkABIs(parentLinkIndex)        += parent_X_visited*Ia;
            bufs.linksBiasWrench(parentLinkIndex) = bufs.linksBiasWrench(parentLinkIndex) + parent_X_visited*pa;
        }
    }

    /**
     * Second forward pass: find robot accelerations
     *
     */
    // \todo TODO Handle gravity
    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
       LinkConstPtr visitedLink = traversal.getLink(traversalEl);
       LinkIndex visitedLinkIndex = visitedLink->getIndex();
       LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
       IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

       if( parentLink == 0 )
       {
           // Preliminary step: find base acceleration
           bufs.linksAccelerations(visitedLinkIndex) = -(bufs.linkABIs(visitedLinkIndex).applyInverse(bufs.linksBiasWrench(visitedLinkIndex)));

           robotAcc.baseAcc() = bufs.linksAccelerations(visitedLinkIndex);
       }
       else
       {
           LinkIndex    parentLinkIndex = parentLink->getIndex();
           if( toParentJoint->getNrOfDOFs() > 0 )
           {
               size_t dofIndex = toParentJoint->getDOFsOffset();
               assert(toParentJoint->getNrOfDOFs()==1);
               bufs.linksAccelerations(visitedLinkIndex) =
                   toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLinkIndex)*bufs.linksAccelerations(parentLinkIndex)
                   + bufs.linksBiasAcceleration(visitedLinkIndex);
               robotAcc.jointAcc()(dofIndex) = (bufs.u(dofIndex)-bufs.U(dofIndex).dot(bufs.linksAccelerations(visitedLinkIndex)))/bufs.D(dofIndex);
               bufs.linksAccelerations(visitedLinkIndex) = bufs.linksAccelerations(visitedLinkIndex) + bufs.S(dofIndex)*robotAcc.jointAcc()(dofIndex);
           }
           else
           {
               //for fixed joints we just propagate the acceleration
               bufs.linksAccelerations(visitedLinkIndex) =
                   toParentJoint->getTransform(robotPos.jointPos(),visitedLinkIndex,parentLinkIndex)*bufs.linksAccelerations(parentLinkIndex)
                   + bufs.linksBiasAcceleration(visitedLinkIndex);
           }
       }
    }

    return true;
}